

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffwend(fitsfile *fptr,int *status)

{
  FITSfile *pFVar1;
  LONGLONG bytepos;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  int tstatus;
  long local_158;
  long local_150;
  char keyrec [81];
  char endkey [81];
  char blankkey [81];
  
  keyrec[0x40] = '\0';
  keyrec[0x41] = '\0';
  keyrec[0x42] = '\0';
  keyrec[0x43] = '\0';
  keyrec[0x44] = '\0';
  keyrec[0x45] = '\0';
  keyrec[0x46] = '\0';
  keyrec[0x47] = '\0';
  keyrec[0x48] = '\0';
  keyrec[0x49] = '\0';
  keyrec[0x4a] = '\0';
  keyrec[0x4b] = '\0';
  keyrec[0x4c] = '\0';
  keyrec[0x4d] = '\0';
  keyrec[0x4e] = '\0';
  keyrec[0x4f] = '\0';
  keyrec[0x30] = '\0';
  keyrec[0x31] = '\0';
  keyrec[0x32] = '\0';
  keyrec[0x33] = '\0';
  keyrec[0x34] = '\0';
  keyrec[0x35] = '\0';
  keyrec[0x36] = '\0';
  keyrec[0x37] = '\0';
  keyrec[0x38] = '\0';
  keyrec[0x39] = '\0';
  keyrec[0x3a] = '\0';
  keyrec[0x3b] = '\0';
  keyrec[0x3c] = '\0';
  keyrec[0x3d] = '\0';
  keyrec[0x3e] = '\0';
  keyrec[0x3f] = '\0';
  keyrec[0x20] = '\0';
  keyrec[0x21] = '\0';
  keyrec[0x22] = '\0';
  keyrec[0x23] = '\0';
  keyrec[0x24] = '\0';
  keyrec[0x25] = '\0';
  keyrec[0x26] = '\0';
  keyrec[0x27] = '\0';
  keyrec[0x28] = '\0';
  keyrec[0x29] = '\0';
  keyrec[0x2a] = '\0';
  keyrec[0x2b] = '\0';
  keyrec[0x2c] = '\0';
  keyrec[0x2d] = '\0';
  keyrec[0x2e] = '\0';
  keyrec[0x2f] = '\0';
  keyrec[0x10] = '\0';
  keyrec[0x11] = '\0';
  keyrec[0x12] = '\0';
  keyrec[0x13] = '\0';
  keyrec[0x14] = '\0';
  keyrec[0x15] = '\0';
  keyrec[0x16] = '\0';
  keyrec[0x17] = '\0';
  keyrec[0x18] = '\0';
  keyrec[0x19] = '\0';
  keyrec[0x1a] = '\0';
  keyrec[0x1b] = '\0';
  keyrec[0x1c] = '\0';
  keyrec[0x1d] = '\0';
  keyrec[0x1e] = '\0';
  keyrec[0x1f] = '\0';
  keyrec[0] = '\0';
  keyrec[1] = '\0';
  keyrec[2] = '\0';
  keyrec[3] = '\0';
  keyrec[4] = '\0';
  keyrec[5] = '\0';
  keyrec[6] = '\0';
  keyrec[7] = '\0';
  keyrec[8] = '\0';
  keyrec[9] = '\0';
  keyrec[10] = '\0';
  keyrec[0xb] = '\0';
  keyrec[0xc] = '\0';
  keyrec[0xd] = '\0';
  keyrec[0xe] = '\0';
  keyrec[0xf] = '\0';
  keyrec[0x50] = '\0';
  if (0 < *status) {
    return *status;
  }
  pFVar1 = fptr->Fptr;
  lVar6 = pFVar1->headend;
  lVar3 = pFVar1->datastart;
  if (lVar3 == -1) {
    lVar3 = (lVar6 - lVar6 % 0xb40) + 0xb40;
    pFVar1->datastart = lVar3;
  }
  lVar4 = (lVar3 - lVar6) / 0x50;
  builtin_strncpy(blankkey + 0x20,"        ",9);
  builtin_strncpy(blankkey + 0x10,"                ",0x10);
  builtin_strncpy(blankkey,"                ",0x10);
  sVar5 = strlen(blankkey);
  builtin_strncpy(blankkey + sVar5,"                                        ",0x29);
  builtin_strncpy(endkey,"END                                     ",0x29);
  sVar5 = strlen(endkey);
  builtin_strncpy(endkey + sVar5,"                                        ",0x29);
  tstatus = 0;
  lVar3 = 0;
  local_158 = lVar6;
  ffmbyt(fptr,lVar6,0,&tstatus);
  lVar6 = 0;
  if (0 < lVar4) {
    lVar6 = lVar4;
  }
  local_150 = lVar4;
  for (; lVar6 != lVar3; lVar3 = lVar3 + 1) {
    ffgbyt(fptr,0x50,keyrec,&tstatus);
    if (tstatus != 0) goto LAB_00141983;
    iVar2 = strncmp(keyrec,blankkey,0x50);
    if ((iVar2 != 0) && (iVar2 = strncmp(keyrec,endkey,0x50), iVar2 != 0)) {
      bVar7 = false;
      goto LAB_00141912;
    }
  }
  bVar7 = tstatus != 0;
  lVar3 = lVar6;
LAB_00141912:
  if ((local_150 == lVar3) && (!bVar7)) {
    lVar3 = fptr->Fptr->datastart + -0xb40;
    if (lVar3 < local_158) {
      lVar3 = local_158;
    }
    ffmbyt(fptr,lVar3,0,&tstatus);
    ffgbyt(fptr,0x50,keyrec,&tstatus);
    iVar2 = strncmp(keyrec,endkey,0x50);
    if (iVar2 == 0 && tstatus == 0) {
      fptr->Fptr->ENDpos = lVar3;
      goto LAB_00141a24;
    }
  }
LAB_00141983:
  bytepos = fptr->Fptr->headend;
  ffmbyt(fptr,bytepos,1,status);
  while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
    ffpbyt(fptr,0x50,blankkey,status);
  }
  lVar6 = fptr->Fptr->datastart + -0xb40;
  if (lVar6 < bytepos) {
    lVar6 = bytepos;
  }
  ffmbyt(fptr,lVar6,0,status);
  ffpbyt(fptr,0x50,endkey,status);
  fptr->Fptr->ENDpos = lVar6;
  if (*status < 1) {
    return *status;
  }
  ffpmsg("Error while writing END card (ffwend).");
LAB_00141a24:
  return *status;
}

Assistant:

int ffwend(fitsfile *fptr,       /* I - FITS file pointer */
            int *status)         /* IO - error status     */
/*
  write the END card and following fill (space chars) in the current header
*/
{
    int ii, tstatus;
    LONGLONG endpos;
    long nspace;
    char blankkey[FLEN_CARD], endkey[FLEN_CARD], keyrec[FLEN_CARD] = "";

    if (*status > 0)
        return(*status);

    endpos = (fptr->Fptr)->headend;

    /* we assume that the HDUposition == curhdu in all cases */

    /*  calc the data starting position if not currently defined */
    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        (fptr->Fptr)->datastart = ( endpos / 2880 + 1 ) * 2880;

    /* calculate the number of blank keyword slots in the header */
    nspace = (long) (( (fptr->Fptr)->datastart - endpos ) / 80);

    /* construct a blank and END keyword (80 spaces )  */
    strcpy(blankkey, "                                        ");
    strcat(blankkey, "                                        ");
    strcpy(endkey, "END                                     ");
    strcat(endkey, "                                        ");
  
    /* check if header is already correctly terminated with END and fill */
    tstatus=0;
    ffmbyt(fptr, endpos, REPORT_EOF, &tstatus); /* move to header end */
    for (ii=0; ii < nspace; ii++)
    {
        ffgbyt(fptr, 80, keyrec, &tstatus);  /* get next keyword */
        if (tstatus) break;
        if (strncmp(keyrec, blankkey, 80) && strncmp(keyrec, endkey, 80))
            break;
    }

    if (ii == nspace && !tstatus)
    {
        /* check if the END keyword exists at the correct position */
        endpos=maxvalue( endpos, ( (fptr->Fptr)->datastart - 2880 ) );
        ffmbyt(fptr, endpos, REPORT_EOF, &tstatus);  /* move to END position */
        ffgbyt(fptr, 80, keyrec, &tstatus); /* read the END keyword */
        if ( !strncmp(keyrec, endkey, 80) && !tstatus) {

            /* store this position, for later reference */
            (fptr->Fptr)->ENDpos = endpos;

            return(*status);    /* END card was already correct */
         }
    }

    /* header was not correctly terminated, so write the END and blank fill */
    endpos = (fptr->Fptr)->headend;
    ffmbyt(fptr, endpos, IGNORE_EOF, status); /* move to header end */
    for (ii=0; ii < nspace; ii++)
        ffpbyt(fptr, 80, blankkey, status);  /* write the blank keywords */

    /*
    The END keyword must either be placed immediately after the last
    keyword that was written (as indicated by the headend value), or
    must be in the first 80 bytes of the 2880-byte FITS record immediately 
    preceeding the data unit, whichever is further in the file. The
    latter will occur if space has been reserved for more header keywords
    which have not yet been written.
    */

    endpos=maxvalue( endpos, ( (fptr->Fptr)->datastart - 2880 ) );
    ffmbyt(fptr, endpos, REPORT_EOF, status);  /* move to END position */

    ffpbyt(fptr, 80, endkey, status); /*  write the END keyword to header */
    
    /* store this position, for later reference */
    (fptr->Fptr)->ENDpos = endpos;

    if (*status > 0)
        ffpmsg("Error while writing END card (ffwend).");

    return(*status);
}